

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

bool spirv_cross::is_reserved_identifier(string *name,bool member,bool allow_reserved_prefixes)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong uVar6;
  
  if (((int)CONCAT71(in_register_00000011,allow_reserved_prefixes) == 0) &&
     (bVar3 = is_reserved_prefix(name), bVar3)) {
    return true;
  }
  uVar1 = name->_M_string_length;
  if (member) {
    if (2 < uVar1) {
      iVar4 = ::std::__cxx11::string::compare((ulong)name,0,(char *)0x2,0x35956e);
      if (iVar4 != 0) {
        return false;
      }
      uVar1 = name->_M_string_length;
      uVar5 = 2;
      if (2 < uVar1) {
        uVar6 = 2;
        do {
          uVar5 = uVar6;
          if (9 < (byte)((name->_M_dataplus)._M_p[uVar6] - 0x30U)) break;
          uVar6 = uVar6 + 1;
          uVar5 = uVar1;
        } while (uVar1 != uVar6);
      }
      return uVar5 == uVar1;
    }
  }
  else if (((1 < uVar1) && (pcVar2 = (name->_M_dataplus)._M_p, *pcVar2 == '_')) &&
          ((byte)(pcVar2[1] - 0x30U) < 10)) {
    if (uVar1 == 2) {
      return true;
    }
    uVar5 = 2;
    do {
      if (9 < (byte)(pcVar2[uVar5] - 0x30U)) {
        return pcVar2[uVar5] == '_';
      }
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
    return true;
  }
  return false;
}

Assistant:

static bool is_reserved_identifier(const string &name, bool member, bool allow_reserved_prefixes)
{
	if (!allow_reserved_prefixes && is_reserved_prefix(name))
		return true;

	if (member)
	{
		// Reserved member identifiers come in one form:
		// _m[0-9]+$.
		if (name.size() < 3)
			return false;

		if (name.compare(0, 2, "_m", 2) != 0)
			return false;

		size_t index = 2;
		while (index < name.size() && is_numeric(name[index]))
			index++;

		return index == name.size();
	}
	else
	{
		// Reserved non-member identifiers come in two forms:
		// _[0-9]+$, used for temporaries which map directly to a SPIR-V ID.
		// _[0-9]+_, used for auxillary temporaries which derived from a SPIR-V ID.
		if (name.size() < 2)
			return false;

		if (name[0] != '_' || !is_numeric(name[1]))
			return false;

		size_t index = 2;
		while (index < name.size() && is_numeric(name[index]))
			index++;

		return index == name.size() || (index < name.size() && name[index] == '_');
	}
}